

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap.c
# Opt level: O0

int pcap_set_snaplen(pcap_t *p,int snaplen)

{
  int iVar1;
  int local_1c;
  int snaplen_local;
  pcap_t *p_local;
  
  iVar1 = pcap_check_activated(p);
  if (iVar1 == 0) {
    if ((snaplen < 1) || (local_1c = snaplen, 0x40000 < snaplen)) {
      local_1c = 0x40000;
    }
    p->snapshot = local_1c;
    p_local._4_4_ = 0;
  }
  else {
    p_local._4_4_ = -4;
  }
  return p_local._4_4_;
}

Assistant:

int
pcap_set_snaplen(pcap_t *p, int snaplen)
{
	if (pcap_check_activated(p))
		return (PCAP_ERROR_ACTIVATED);

	/*
	 * Turn invalid values, or excessively large values, into
	 * the maximum allowed value.
	 *
	 * If some application really *needs* a bigger snapshot
	 * length, we should just increase MAXIMUM_SNAPLEN.
	 */
	if (snaplen <= 0 || snaplen > MAXIMUM_SNAPLEN)
		snaplen = MAXIMUM_SNAPLEN;
	p->snapshot = snaplen;
	return (0);
}